

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

FrameBuffer * __thiscall Imf_2_5::TiledInputFile::frameBuffer(TiledInputFile *this)

{
  Data *pDVar1;
  Lock local_20;
  
  local_20._mutex = &this->_data->_streamData->super_Mutex;
  std::mutex::lock(local_20._mutex);
  local_20._locked = true;
  pDVar1 = this->_data;
  IlmThread_2_5::Lock::~Lock(&local_20);
  return &pDVar1->frameBuffer;
}

Assistant:

const FrameBuffer &
TiledInputFile::frameBuffer () const
{
    Lock lock (*_data->_streamData);
    return _data->frameBuffer;
}